

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classical_ising_polynomial.hpp
# Opt level: O1

Vartype __thiscall
openjij::system::ClassicalIsingPolynomial<openjij::graph::Polynomial<double>_>::ConvertVartype
          (ClassicalIsingPolynomial<openjij::graph::Polynomial<double>_> *this,string *vartype)

{
  int iVar1;
  Vartype VVar2;
  runtime_error *this_00;
  
  iVar1 = std::__cxx11::string::compare((char *)vartype);
  if (iVar1 == 0) {
    VVar2 = SPIN;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)vartype);
    VVar2 = BINARY;
    if (iVar1 != 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Unknown vartype detected");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return VVar2;
}

Assistant:

cimod::Vartype ConvertVartype(const std::string vartype) const {
    if (vartype == "SPIN") {
      return cimod::Vartype::SPIN;
    } else if (vartype == "BINARY") {
      return cimod::Vartype::BINARY;
    } else {
      throw std::runtime_error("Unknown vartype detected");
    }
  }